

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void array_container_intersection
               (array_container_t *array1,array_container_t *array2,array_container_t *out)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  size_t size_l;
  uint16_t *large;
  int iVar5;
  uint16_t *small;
  uint16_t *buffer;
  size_t s_b;
  size_t s_a;
  
  iVar1 = array1->cardinality;
  s_a = (size_t)iVar1;
  iVar2 = array2->cardinality;
  s_b = (size_t)iVar2;
  iVar5 = iVar2;
  if (iVar1 < iVar2) {
    iVar5 = iVar1;
  }
  if (out->capacity < iVar5) {
    array_container_grow(out,iVar5 + 8,false);
  }
  if (iVar1 * 0x40 < iVar2) {
    small = array1->array;
    large = array2->array;
    buffer = out->array;
    size_l = s_b;
    s_b = s_a;
  }
  else {
    if (iVar1 <= iVar2 * 0x40) {
      uVar4 = croaring_hardware_support();
      if ((uVar4 & 1) == 0) {
        iVar3 = intersect_uint16(array1->array,s_a,array2->array,s_b,out->array);
      }
      else {
        iVar3 = intersect_vector16(array1->array,s_a,array2->array,s_b,out->array);
      }
      goto LAB_001033eb;
    }
    small = array2->array;
    large = array1->array;
    buffer = out->array;
    size_l = s_a;
  }
  iVar3 = intersect_skewed_uint16(small,s_b,large,size_l,buffer);
LAB_001033eb:
  out->cardinality = iVar3;
  return;
}

Assistant:

void array_container_intersection(const array_container_t *array1,
                                  const array_container_t *array2,
                                  array_container_t *out) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality,
            min_card = minimum_int32(card_1, card_2);
    const int threshold = 64;  // subject to tuning
#if CROARING_IS_X64
    if (out->capacity < min_card) {
        array_container_grow(out, min_card + sizeof(__m128i) / sizeof(uint16_t),
                             false);
    }
#else
    if (out->capacity < min_card) {
        array_container_grow(out, min_card, false);
    }
#endif

    if (card_1 * threshold < card_2) {
        out->cardinality = intersect_skewed_uint16(
            array1->array, card_1, array2->array, card_2, out->array);
    } else if (card_2 * threshold < card_1) {
        out->cardinality = intersect_skewed_uint16(
            array2->array, card_2, array1->array, card_1, out->array);
    } else {
#if CROARING_IS_X64
        if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
            out->cardinality = intersect_vector16(
                array1->array, card_1, array2->array, card_2, out->array);
        } else {
            out->cardinality = intersect_uint16(
                array1->array, card_1, array2->array, card_2, out->array);
        }
#else
        out->cardinality = intersect_uint16(array1->array, card_1,
                                            array2->array, card_2, out->array);
#endif
    }
}